

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O0

REF_STATUS ref_matrix_diag_m2(REF_DBL *m,REF_DBL *d)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double local_f8;
  double local_e8;
  double local_e0;
  double local_d0;
  double local_c8;
  double local_b8;
  double local_b0;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_70;
  REF_DBL mid;
  REF_DBL ss;
  REF_DBL cc;
  REF_DBL s;
  REF_DBL c;
  REF_DBL l;
  REF_DBL norm;
  REF_DBL s2;
  REF_DBL c2;
  REF_DBL *d_local;
  REF_DBL *m_local;
  
  if (((0x7fefffffffffffff < (ulong)ABS(*m)) || (0x7fefffffffffffff < (ulong)ABS(m[1]))) ||
     (0x7fefffffffffffff < (ulong)ABS(m[2]))) {
    return 3;
  }
  dVar1 = (*m - m[2]) * 0.5;
  dVar2 = m[1];
  local_70 = dVar1;
  if (dVar1 <= 0.0) {
    local_70 = -dVar1;
  }
  local_80 = dVar2;
  if (dVar2 <= 0.0) {
    local_80 = -dVar2;
  }
  if (local_70 <= local_80) {
    local_98 = dVar2;
    if (dVar2 <= 0.0) {
      local_98 = -dVar2;
    }
    local_90 = local_98;
  }
  else {
    local_88 = dVar1;
    if (dVar1 <= 0.0) {
      local_88 = -dVar1;
    }
    local_90 = local_88;
  }
  if (local_90 * 1e+20 <= 0.0) {
    local_a0 = -(local_90 * 1e+20);
  }
  else {
    local_a0 = local_90 * 1e+20;
  }
  local_b0 = dVar1;
  if (dVar1 <= 0.0) {
    local_b0 = -dVar1;
  }
  if (local_b0 < local_a0) {
    if (local_90 * 1e+20 <= 0.0) {
      local_b8 = -(local_90 * 1e+20);
    }
    else {
      local_b8 = local_90 * 1e+20;
    }
    local_c8 = dVar2;
    if (dVar2 <= 0.0) {
      local_c8 = -dVar2;
    }
    if (local_c8 < local_b8) {
      dVar1 = dVar1 / local_90;
      dVar2 = dVar2 / local_90;
      dVar3 = sqrt(dVar1 * dVar1 + dVar2 * dVar2);
      if (dVar3 * 1e+20 <= 0.0) {
        local_d0 = -(dVar3 * 1e+20);
      }
      else {
        local_d0 = dVar3 * 1e+20;
      }
      local_e0 = dVar1;
      if (dVar1 <= 0.0) {
        local_e0 = -dVar1;
      }
      if (local_d0 <= local_e0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",
               0x115,"ref_matrix_diag_m2","c2/l");
        return 1;
      }
      if (dVar3 * 1e+20 <= 0.0) {
        local_e8 = -(dVar3 * 1e+20);
      }
      else {
        local_e8 = dVar3 * 1e+20;
      }
      local_f8 = dVar2;
      if (dVar2 <= 0.0) {
        local_f8 = -dVar2;
      }
      if (local_e8 <= local_f8) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",
               0x116,"ref_matrix_diag_m2","s2/l");
        return 1;
      }
      s2 = dVar1 / dVar3;
      norm = dVar2 / dVar3;
      if (0.0 < s2) {
        s2 = -s2;
        norm = -norm;
      }
      goto LAB_0018f5e0;
    }
  }
  s2 = -1.0;
  norm = 0.0;
LAB_0018f5e0:
  dVar1 = sqrt((1.0 - s2) * 0.5);
  dVar3 = (norm * 0.5) / dVar1;
  dVar2 = m[1];
  *d = dVar1 * dVar1 * *m + dVar3 * dVar3 * m[2] + -(norm * dVar2);
  d[1] = dVar1 * dVar1 * m[2] + dVar3 * dVar3 * *m + norm * dVar2;
  d[2] = dVar1;
  d[3] = -dVar3;
  d[4] = dVar3;
  d[5] = dVar1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_diag_m2(REF_DBL *m, REF_DBL *d) {
  REF_DBL c2, s2, norm, l, c, s, cc, ss, mid;
  /* if inf or nan */
  if (!isfinite(m[0]) || !isfinite(m[1]) || !isfinite(m[2])) {
    return REF_INVALID;
  }

  /* one rotation ( zero out m[2] ) */
  /* http://www.geometrictools.com/Documentation/ */
  /* Eigen System Solvers for Symmetric Matrices, David Eberly */

  c2 = 0.5 * (m[0] - m[2]);
  s2 = m[1];
  norm = MAX(ABS(c2), ABS(s2));

  if (ref_math_divisible(c2, norm) && ref_math_divisible(s2, norm)) {
    c2 /= norm;
    s2 /= norm;
    l = sqrt(c2 * c2 + s2 * s2);
    RAS(ref_math_divisible(c2, l), "c2/l");
    RAS(ref_math_divisible(s2, l), "s2/l");
    c2 /= l;
    s2 /= l;
    if (c2 > 0.0) {
      c2 = -c2;
      s2 = -s2;
    }
  } else {
    c2 = -1.0;
    s2 = 0.0;
  }

  s = sqrt(0.5 * (1.0 - c2));
  c = 0.5 * s2 / s;
  cc = c * c;
  ss = s * s;
  mid = s2 * m[1];

  /*
  printf("  m00 %f m01 %f m11 %f\n", m[0], m[1], m[2]);
  printf("  c2 %f s2 %f c %f s %f\n", c2, s2, c, s);
  printf("  cc %f ss %f mid %f\n", cc, ss, mid);
  printf("  e %f %f %f e %f %f %f\n", cc * m[2], -mid, ss * m[0], cc * m[0],
         mid, ss * m[2]);
  printf("  e %f e %f\n", cc * m[2] - mid + ss * m[0],
         cc * m[0] + mid + ss * m[2]);
  */

  ref_matrix_eig2(d, 0) = cc * m[2] - mid + ss * m[0];
  ref_matrix_eig2(d, 1) = cc * m[0] + mid + ss * m[2];

  ref_matrix_vec2(d, 0, 0) = s;
  ref_matrix_vec2(d, 1, 0) = -c;

  ref_matrix_vec2(d, 0, 1) = c;
  ref_matrix_vec2(d, 1, 1) = s;

  return REF_SUCCESS;
}